

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O2

quaternion * quaternion_rotate_by_axis_angle_EXP(quaternion *self,vector3 *axis,float angle)

{
  quaternion qT;
  quaternion local_20;
  
  quaternion_set_from_axis_anglev3(&local_20,axis,angle);
  quaternion_rotate_by_quaternion_EXP(self,&local_20);
  return self;
}

Assistant:

HYPAPI struct quaternion *quaternion_rotate_by_axis_angle_EXP(struct quaternion *self, const struct vector3 *axis, HYP_FLOAT angle)
{
	struct quaternion qT;

	quaternion_set_from_axis_anglev3(&qT, axis, angle);
	quaternion_rotate_by_quaternion_EXP(self, &qT);

	return self;
}